

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

long anon_unknown.dwarf_28f7f8::copy_data(archive *ar,archive *aw)

{
  int iVar1;
  char *title;
  int64_t local_40;
  la_int64_t offset;
  size_t size;
  void *buff;
  long r;
  archive *aw_local;
  archive *ar_local;
  
  r = (long)aw;
  aw_local = ar;
  while( true ) {
    iVar1 = archive_read_data_block(aw_local,(void **)&size,(size_t *)&offset,&local_40);
    buff = (void *)(long)iVar1;
    if (buff == (void *)0x1) {
      return 0;
    }
    if (buff != (void *)0x0) break;
    buff = (void *)archive_write_data_block((archive *)r,(void *)size,offset,local_40);
    if (buff != (void *)0x0) {
      title = archive_error_string((archive *)r);
      cmSystemTools::Message("archive_write_data_block()",title);
      return (long)buff;
    }
    buff = (void *)0x0;
  }
  return (long)buff;
}

Assistant:

long copy_data(struct archive *ar, struct archive *aw)
{
  long r;
  const void *buff;
  size_t size;
#if defined(ARCHIVE_VERSION_NUMBER) && ARCHIVE_VERSION_NUMBER >= 3000000
  __LA_INT64_T offset;
#else
  off_t offset;
#endif

  for (;;)
    {
    r = archive_read_data_block(ar, &buff, &size, &offset);
    if (r == ARCHIVE_EOF)
      {
      return (ARCHIVE_OK);
      }
    if (r != ARCHIVE_OK)
      {
      return (r);
      }
    r = archive_write_data_block(aw, buff, size, offset);
    if (r != ARCHIVE_OK)
      {
      cmSystemTools::Message("archive_write_data_block()",
                             archive_error_string(aw));
      return (r);
      }
    }
#if !defined(__clang__) && !defined(__HP_aCC)
  return r; /* this should not happen but it quiets some compilers */
#endif
}